

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O3

int __thiscall Server::Private::remove(Private *this,char *__filename)

{
  usize *puVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *pIVar4;
  
  if (*(long *)(__filename + 0x10) != 0) {
    *(undefined8 *)(*(long *)(__filename + 0x10) + 0xa8) = 0;
  }
  Socket::Poll::remove(&this->_sockets,__filename);
  pIVar2 = *(Item **)(__filename + -0x10);
  pIVar3 = *(Item **)(__filename + -8);
  pIVar4 = (Item *)&this->_establishers;
  if (pIVar2 != (Item *)0x0) {
    pIVar4 = pIVar2;
  }
  ((Iterator *)&pIVar4->next)->item = pIVar3;
  pIVar3->prev = pIVar2;
  puVar1 = &(this->_establishers)._size;
  *puVar1 = *puVar1 - 1;
  Socket::~Socket((Socket *)__filename);
  pIVar2 = (this->_establishers).freeItem;
  *(Item **)(__filename + -0x10) = pIVar2;
  (this->_establishers).freeItem = (Item *)(__filename + -0x10);
  return (int)pIVar2;
}

Assistant:

void Server::Private::remove(EstablisherImpl &establisher)
{
  if (establisher.resolver)
    establisher.resolver->establisher = 0;
  _sockets.remove(establisher);
  _establishers.remove(establisher);
}